

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

char * lws_cmdline_option(int argc,char **argv,char *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int local_30;
  int c;
  int n;
  char *val_local;
  char **argv_local;
  char *pcStack_10;
  int argc_local;
  
  sVar4 = strlen(val);
  iVar1 = (int)sVar4;
  iVar2 = argc;
  do {
    local_30 = iVar2;
    iVar2 = local_30 + -1;
    if (iVar2 < 1) {
      return (char *)0x0;
    }
    iVar3 = strncmp(argv[iVar2],val,(long)iVar1);
  } while (iVar3 != 0);
  if ((argv[iVar2][iVar1] == '\0') && (iVar2 < argc + -1)) {
    if ((argv[local_30] == (char *)0x0) || (sVar4 = strlen(argv[local_30]), 0x400 < sVar4)) {
      pcStack_10 = (char *)0x0;
    }
    else {
      pcStack_10 = argv[local_30];
    }
  }
  else if (argv[iVar2][iVar1] == '=') {
    pcStack_10 = argv[iVar2] + (iVar1 + 1);
  }
  else {
    pcStack_10 = argv[iVar2] + iVar1;
  }
  return pcStack_10;
}

Assistant:

const char *
lws_cmdline_option(int argc, const char **argv, const char *val)
{
	int n = (int)strlen(val), c = argc;

	while (--c > 0) {

		if (!strncmp(argv[c], val, n)) {
			if (!*(argv[c] + n) && c < argc - 1) {
				/* coverity treats unchecked argv as "tainted" */
				if (!argv[c + 1] || strlen(argv[c + 1]) > 1024)
					return NULL;
				return argv[c + 1];
			}

			if (argv[c][n] == '=')
				return &argv[c][n + 1];
			return argv[c] + n;
		}
	}

	return NULL;
}